

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O2

void __thiscall wasm::Instrumenter::instrumentFuncs(Instrumenter *this)

{
  char **ppcVar1;
  StorageKind SVar2;
  pointer puVar3;
  pointer puVar4;
  Function *pFVar5;
  string_view name;
  Name NVar6;
  char *pcVar7;
  GlobalGet *pGVar8;
  Unary *condition;
  Binary *value;
  GlobalSet *left;
  GlobalSet *right;
  If *left_00;
  Address offset;
  Const *pCVar9;
  Const *value_00;
  Store *left_01;
  Block *pBVar10;
  Memory *pMVar11;
  ulong uVar12;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar13;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> type_02;
  undefined1 auStack_1e8 [8];
  Name memoryName;
  Builder local_50;
  Builder builder;
  
  local_50.wasm = this->wasm;
  SVar2 = this->config->storageKind;
  if (SVar2 - InMemory < 2) {
    if ((((local_50.wasm)->features).features & 1) == 0) {
      Fatal::Fatal((Fatal *)auStack_1e8);
      ppcVar1 = &memoryName.super_IString.str._M_str;
      std::operator<<((ostream *)ppcVar1,"error: --");
      pcVar7 = "--in-secondary-memory";
      if (SVar2 == InMemory) {
        pcVar7 = "--in-memory";
      }
      std::operator<<((ostream *)ppcVar1,pcVar7 + 2);
      Fatal::operator<<((Fatal *)auStack_1e8,(char (*) [32])" requires atomics to be enabled");
      Fatal::~Fatal((Fatal *)auStack_1e8);
    }
    puVar3 = ((local_50.wasm)->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar3 == ((local_50.wasm)->memories).
                  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("!wasm->memories.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/instrumenter.cpp"
                    ,0x8e,"void wasm::Instrumenter::instrumentFuncs()");
    }
    if (SVar2 == InMemory) {
      pMVar11 = (puVar3->_M_t).
                super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    }
    else {
      pMVar11 = (Memory *)&this->secondaryMemory;
    }
    auStack_1e8 = *(undefined1 (*) [8])&(pMVar11->super_Importable).super_Named.name;
    memoryName.super_IString.str._M_len =
         *(size_t *)((long)&(pMVar11->super_Importable).super_Named.name + 8);
    puVar4 = ((local_50.wasm)->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    offset.addr = 0;
    for (puVar13 = ((local_50.wasm)->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar4;
        puVar13 = puVar13 + 1) {
      pFVar5 = (puVar13->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar5->super_Importable).module + 8) == (char *)0x0) {
        builder.wasm = (Module *)offset.addr;
        pCVar9 = Builder::makeConstPtr(&local_50,0,(Type)0x2);
        value_00 = Builder::makeConst<unsigned_int>(&local_50,1);
        NVar6.super_IString.str._M_str = (char *)memoryName.super_IString.str._M_len;
        NVar6.super_IString.str._M_len = (size_t)auStack_1e8;
        left_01 = Builder::makeStore(&local_50,1,offset,1,(Expression *)pCVar9,
                                     (Expression *)value_00,(Type)0x2,NVar6);
        left_01->isAtomic = true;
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)(pFVar5->body->type).id;
        pBVar10 = Builder::makeSequence(&local_50,(Expression *)left_01,pFVar5->body,type_01);
        pFVar5->body = (Expression *)pBVar10;
        offset.addr = (address64_t)((int)builder.wasm + 1);
      }
    }
  }
  else if (SVar2 == InGlobals) {
    builder.wasm = (Module *)
                   (this->functionGlobals).
                   super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start;
    puVar4 = ((local_50.wasm)->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar13 = ((local_50.wasm)->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar4;
        puVar13 = puVar13 + 1) {
      pFVar5 = (puVar13->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar5->super_Importable).module + 8) == (char *)0x0) {
        pGVar8 = Builder::makeGlobalGet
                           (&local_50,
                            (IString)*(IString *)
                                      &((builder.wasm)->exports).
                                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                       ._M_impl.super__Vector_impl_data,(Type)0x2);
        condition = Builder::makeUnary(&local_50,EqZInt32,(Expression *)pGVar8);
        name = (this->counterGlobal).super_IString.str;
        pGVar8 = Builder::makeGlobalGet
                           (&local_50,(Name)(this->counterGlobal).super_IString.str,(Type)0x2);
        wasm::Literal::makeOne((Type)auStack_1e8);
        pCVar9 = Builder::makeConst(&local_50,(Literal *)auStack_1e8);
        value = Builder::makeBinary(&local_50,AddInt32,(Expression *)pGVar8,(Expression *)pCVar9);
        left = Builder::makeGlobalSet(&local_50,(Name)name,(Expression *)value);
        NVar6.super_IString.str =
             *(IString *)
              &((builder.wasm)->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data;
        pGVar8 = Builder::makeGlobalGet
                           (&local_50,(Name)(this->counterGlobal).super_IString.str,(Type)0x2);
        right = Builder::makeGlobalSet(&local_50,NVar6,(Expression *)pGVar8);
        uVar12 = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pGVar8;
        pBVar10 = Builder::makeSequence(&local_50,(Expression *)left,(Expression *)right,type);
        type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar12;
        left_00 = Builder::makeIf(&local_50,(Expression *)condition,(Expression *)pBVar10,
                                  (Expression *)0x0,type_02);
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)(pFVar5->body->type).id;
        pBVar10 = Builder::makeSequence(&local_50,(Expression *)left_00,pFVar5->body,type_00);
        pFVar5->body = (Expression *)pBVar10;
        wasm::Literal::~Literal((Literal *)auStack_1e8);
        builder.wasm = (Module *)
                       &((builder.wasm)->exports).
                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
    }
  }
  return;
}

Assistant:

void Instrumenter::instrumentFuncs() {
  // Inject code at the beginning of each function to advance the monotonic
  // counter and set the function's timestamp if it hasn't already been set.
  Builder builder(*wasm);
  switch (config.storageKind) {
    case WasmSplitOptions::StorageKind::InGlobals: {
      // (if (i32.eqz (global.get $timestamp))
      //   (block
      //     (global.set $monotonic_counter
      //       (i32.add
      //         (global.get $monotonic_counter)
      //         (i32.const 1)
      //       )
      //     )
      //     (global.set $timestamp
      //       (global.get $monotonic_counter)
      //     )
      //   )
      // )
      auto globalIt = functionGlobals.begin();
      ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
        func->body = builder.makeSequence(
          builder.makeIf(
            builder.makeUnary(EqZInt32,
                              builder.makeGlobalGet(*globalIt, Type::i32)),
            builder.makeSequence(
              builder.makeGlobalSet(
                counterGlobal,
                builder.makeBinary(
                  AddInt32,
                  builder.makeGlobalGet(counterGlobal, Type::i32),
                  builder.makeConst(Literal::makeOne(Type::i32)))),
              builder.makeGlobalSet(
                *globalIt, builder.makeGlobalGet(counterGlobal, Type::i32)))),
          func->body,
          func->body->type);
        ++globalIt;
      });
      break;
    }
    case WasmSplitOptions::StorageKind::InMemory:
    case WasmSplitOptions::StorageKind::InSecondaryMemory: {
      if (!wasm->features.hasAtomics()) {
        const char* command =
          config.storageKind == WasmSplitOptions::StorageKind::InMemory
            ? "in-memory"
            : "in-secondary-memory";
        Fatal() << "error: --" << command << " requires atomics to be enabled";
      }
      // (i32.atomic.store8 offset=funcidx (i32.const 0) (i32.const 1))
      Index funcIdx = 0;
      assert(!wasm->memories.empty());
      Name memoryName =
        config.storageKind == WasmSplitOptions::StorageKind::InMemory
          ? wasm->memories[0]->name
          : secondaryMemory;
      ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
        func->body = builder.makeSequence(
          builder.makeAtomicStore(1,
                                  funcIdx,
                                  builder.makeConstPtr(0, Type::i32),
                                  builder.makeConst(uint32_t(1)),
                                  Type::i32,
                                  memoryName),
          func->body,
          func->body->type);
        ++funcIdx;
      });
      break;
    }
  }
}